

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FatEntry.cpp
# Opt level: O2

bool __thiscall FatEntry::isCorrect(FatEntry *this)

{
  byte bVar1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  FatEntry *this_00;
  int i;
  long lVar5;
  
  bVar1 = this->attributes;
  if (bVar1 == 0 || (bVar1 & 0x30) != 0) {
    this_00 = this;
    if (((bVar1 & 0x10) != 0) && (this->cluster == 0)) {
      getFilename_abi_cxx11_((string *)&stack0xffffffffffffffc0,this);
      bVar3 = std::operator!=((string *)&stack0xffffffffffffffc0,"..");
      this_00 = (FatEntry *)&stack0xffffffffffffffc0;
      std::__cxx11::string::~string((string *)this_00);
      if (bVar3) goto LAB_0010d863;
    }
    pcVar2 = (this->data)._M_dataplus._M_p;
    lVar5 = 1;
    do {
      bVar3 = lVar5 != 0xb;
      if (lVar5 == 0xb) {
        return bVar3;
      }
      bVar4 = printable(this_00,pcVar2[lVar5]);
      lVar5 = lVar5 + 1;
    } while (!bVar4);
  }
  else {
LAB_0010d863:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool FatEntry::isCorrect()
{
    if (attributes && !(attributes&FAT_ATTRIBUTES_DIR) && !(attributes&FAT_ATTRIBUTES_FILE)) {
        return false;
    }

    if (isDirectory() && cluster == 0 && getFilename()!="..") {
        return false;
    }

    for (int i=1; i<11; i++) {
        if (printable(data[i])) {
            return true;
        }
    }

    return false;
}